

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.h
# Opt level: O2

int __thiscall
rlib::sequencer::MmlCompiler::EventPitchBend::clone
          (EventPitchBend *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::
  make_shared<rlib::sequencer::MmlCompiler::EventPitchBend,rlib::sequencer::MmlCompiler::EventPitchBend_const&>
            ((EventPitchBend *)&local_18);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Event)._vptr_Event = local_18;
  (this->super_Event).position = (size_t)_Var1._M_pi;
  local_18 = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  return (int)this;
}

Assistant:

virtual std::shared_ptr<Event> clone()const {
				return std::make_shared<EventPitchBend>(*this);
			}